

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Execute<duckdb::timestamp_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::timestamp_t,duckdb::string_t>>
               (ArgMinMaxState<duckdb::timestamp_t,_duckdb::string_t> *state,timestamp_t x_data,
               string_t y_data,AggregateBinaryInput *binary)

{
  bool bVar1;
  ArgMinMaxState<duckdb::timestamp_t,_duckdb::string_t> *in_RCX;
  timestamp_t *in_RDX;
  string_t *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  string_t *in_stack_ffffffffffffffc8;
  string_t *in_stack_ffffffffffffffd0;
  
  bVar1 = LessThan::Operation<duckdb::string_t>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
  ;
  if (bVar1) {
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_R8,(idx_t)in_RDI);
    Assign<duckdb::timestamp_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::timestamp_t,duckdb::string_t>>
              (in_RCX,in_RDX,in_RDI,SUB81((ulong)in_R8 >> 0x38,0));
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}